

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreCompare.cpp
# Opt level: O2

bool mathCore::is_sum(expression *a)

{
  bool bVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  
  bVar3 = true;
  if ((a->FLAGS & 3U) == 0) {
    if ((a->FLAGS & 0x20U) == 0) {
      bVar3 = false;
    }
    else {
      for (p_Var2 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar3 = (_Rb_tree_header *)p_Var2 == &(a->contents)._M_t._M_impl.super__Rb_tree_header,
          !bVar3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        bVar1 = is_sum(*(expression **)(p_Var2 + 1));
        if (!bVar1) {
          return bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool mathCore::is_var(expression* a) {
	return a->FLAGS & F_VAR;
}